

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamer.cpp
# Opt level: O1

void __thiscall
streamer::Streamer::stream_frame(Streamer *this,uint8_t *data,int64_t frame_duration)

{
  int64_t *piVar1;
  AVFrame *pAVar2;
  int stride [1];
  uint8_t *local_20;
  int local_14;
  
  if (((this->network_init_ok == true) && (this->rtmp_server_conn == true)) &&
     (this->init_ok == true)) {
    local_14 = (this->config).src_width * 3;
    pAVar2 = (this->picture).frame;
    local_20 = data;
    sws_scale((this->scaler).ctx,&local_20,&local_14,0,(this->config).src_height,pAVar2,
              pAVar2->linesize);
    pAVar2 = (this->picture).frame;
    piVar1 = &pAVar2->pts;
    *piVar1 = *piVar1 + frame_duration;
    encode_and_write_frame(this->out_codec_ctx,this->format_ctx,pAVar2);
  }
  return;
}

Assistant:

void Streamer::stream_frame(const uint8_t *data, int64_t frame_duration)
{
    if(can_stream()) {
        const int stride[] = {static_cast<int>(config.src_width*3)};
        sws_scale(scaler.ctx, &data, stride, 0, config.src_height, picture.frame->data, picture.frame->linesize);
        picture.frame->pts += frame_duration; //time of frame in milliseconds
        encode_and_write_frame(out_codec_ctx, format_ctx, picture.frame);
    }
}